

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O1

DdNode * BuildSubsetBdd(DdManager *dd,st__table *pathTable,DdNode *node,AssortedInfo *info,
                       st__table *subsetNodeTable)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  FILE *__s;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  DdNode *pDVar8;
  int iVar9;
  ulong uVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  size_t __size;
  char *__ptr;
  DdNode *pDVar13;
  int *key;
  DdNode *pDVar14;
  DdNode *pDVar15;
  int *piVar16;
  int *piVar17;
  NodeDist_t *nodeStat;
  char *entry;
  NodeDist_t *nodeStatNnv;
  NodeDist_t *nodeStatNv;
  uint local_a4;
  char *local_68;
  DdNode *local_60;
  DdNode *local_58;
  int *local_50;
  char *local_48;
  int *local_40;
  int *local_38;
  
  pDVar11 = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (pDVar11->index == 0x7fffffff) {
    return node;
  }
  iVar1 = st__lookup(pathTable,(char *)pDVar11,&local_68);
  if (iVar1 == 0) {
    __s = (FILE *)dd->err;
    __ptr = "Something wrong, node must be in table \n";
    __size = 0x28;
    goto LAB_007e319a;
  }
  local_60 = (DdNode *)((ulong)node & 1);
  if (local_60 == (DdNode *)0x0) {
    pDVar12 = *(DdNode **)(local_68 + 0x10);
  }
  else {
    pDVar12 = *(DdNode **)(local_68 + 0x18);
  }
  if (pDVar12 != (DdNode *)0x0) {
    return pDVar12;
  }
  pDVar12 = (pDVar11->type).kids.T;
  pDVar14 = (pDVar11->type).kids.E;
  pDVar8 = (DdNode *)((ulong)local_60 ^ (ulong)pDVar12);
  piVar17 = (int *)((ulong)pDVar12 & 0xfffffffffffffffe);
  if (*piVar17 == 0x7fffffff) {
    if ((dd->one == pDVar8) && (info->findShortestPath != 0)) {
      info->findShortestPath = 0;
    }
    piVar17[1] = piVar17[1] + 1;
    piVar17 = (int *)0x0;
    if (local_60 == pDVar12) {
      return (DdNode *)0x0;
    }
    iVar1 = 1;
    uVar3 = 0xffffffff;
    local_a4 = 0;
    pDVar12 = pDVar8;
LAB_007e32c4:
    pDVar13 = (DdNode *)((ulong)local_60 ^ (ulong)pDVar14);
    key = (int *)((ulong)pDVar14 & 0xfffffffffffffffe);
    local_58 = node;
    if (*key == 0x7fffffff) {
      if ((dd->one == pDVar13) && (info->findShortestPath != 0)) {
        info->findShortestPath = 0;
      }
      key[1] = key[1] + 1;
      uVar5 = 0;
      if (local_60 == pDVar14) {
        return (DdNode *)0x0;
      }
      uVar6 = 0xffffffff;
      key = (int *)0x0;
      pDVar14 = pDVar13;
      iVar9 = iVar1 + 1;
LAB_007e33ac:
      local_50 = piVar17;
      do {
        pDVar15 = pDVar13;
        piVar16 = key;
        uVar7 = uVar5;
        if (iVar9 == 0) {
          if (local_a4 == uVar5 && uVar3 <= uVar6 || local_a4 < uVar5) {
            iVar1 = 1;
            pDVar15 = pDVar8;
            piVar16 = piVar17;
            uVar7 = local_a4;
          }
        }
        else {
          if (iVar9 == 2) {
            info->findShortestPath = 0;
            uVar3 = Cudd_NodeReadIndex(pDVar11);
            pDVar11 = Cudd_ReadVars(dd,uVar3);
            piVar17 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
            *piVar17 = *piVar17 + 1;
            pDVar8 = cuddBddIteRecur(dd,pDVar11,pDVar12,pDVar14);
            if (pDVar8 != (DdNode *)0x0) {
              piVar17 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              *piVar17 = *piVar17 + 1;
            }
            Cudd_RecursiveDeref(dd,pDVar11);
            Cudd_RecursiveDeref(dd,pDVar12);
            Cudd_RecursiveDeref(dd,pDVar14);
            pDVar11 = local_58;
            if (subsetNodeTable != (st__table *)0x0) {
              piVar17 = (int *)((ulong)pDVar8 & 0xfffffffffffffffe);
              iVar1 = st__lookup(subsetNodeTable,(char *)piVar17,&local_48);
              if ((iVar1 == 0) && (*piVar17 != 0x7fffffff)) {
                iVar1 = st__insert(subsetNodeTable,(char *)piVar17,(char *)0x0);
                if (iVar1 == -10000) {
                  fwrite("Out of memory\n",0xe,1,(FILE *)dd->err);
                  return (DdNode *)0x0;
                }
                if (info->threshold < subsetNodeTable->num_entries) {
                  info->thresholdReached = 0;
                }
              }
            }
            if (pDVar8 == (DdNode *)0x0) {
              return (DdNode *)0x0;
            }
            uVar10 = (ulong)pDVar8 & 0xfffffffffffffffe;
            if (local_60 == (DdNode *)0x0) {
              *(DdNode **)(local_68 + 0x10) = pDVar8;
              *(int *)(uVar10 + 4) = *(int *)(uVar10 + 4) + 1;
              if (pDVar8 != pDVar11) goto LAB_007e373a;
              if (*(DdNode **)(local_68 + 0x18) != (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,*(DdNode **)(local_68 + 0x18));
              }
              *(ulong *)(local_68 + 0x18) = (ulong)pDVar8 ^ 1;
            }
            else {
              *(DdNode **)(local_68 + 0x18) = pDVar8;
              *(int *)(uVar10 + 4) = *(int *)(uVar10 + 4) + 1;
              if (pDVar8 != pDVar11) goto LAB_007e373a;
              if (*(DdNode **)(local_68 + 0x10) != (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,*(DdNode **)(local_68 + 0x10));
              }
              *(ulong *)(local_68 + 0x10) = (ulong)pDVar8 ^ 1;
            }
            *(int *)(uVar10 + 4) = *(int *)(uVar10 + 4) + 1;
LAB_007e373a:
            *(int *)(uVar10 + 4) = *(int *)(uVar10 + 4) + -1;
            return pDVar8;
          }
          if (iVar1 == 0) {
            uVar7 = local_a4;
            pDVar15 = pDVar8;
            piVar16 = piVar17;
          }
          iVar1 = 1;
        }
        pDVar4 = zero;
        if (uVar7 <= info->maxpath) {
          if (uVar7 < info->maxpath) {
            if (info->findShortestPath != 0) {
              info->findShortestPath = 0;
            }
            pDVar4 = BuildSubsetBdd(dd,pathTable,pDVar15,info,subsetNodeTable);
            piVar17 = local_50;
          }
          else {
            iVar2 = st__lookup(info->maxpathTable,(char *)piVar16,&local_48);
            if (iVar2 == 0) {
              if (info->thresholdReached < 1) {
                pDVar4 = zero;
                if (info->findShortestPath != 0) {
                  iVar2 = st__insert(info->maxpathTable,(char *)piVar16,(char *)0x0);
                  if (iVar2 == -10000) goto LAB_007e351e;
                  info->thresholdReached = info->thresholdReached + -1;
                  goto LAB_007e3566;
                }
              }
              else {
                iVar2 = st__insert(info->maxpathTable,(char *)piVar16,(char *)0x0);
                if (iVar2 != -10000) {
                  iVar2 = info->thresholdReached;
                  info->thresholdReached = iVar2 + -1;
                  if (iVar2 < 2) {
                    info->findShortestPath = 1;
                  }
                  goto LAB_007e3566;
                }
LAB_007e351e:
                memOut = 1;
                fwrite("OUT of memory\n",0xe,1,(FILE *)dd->err);
                info->thresholdReached = 0;
                pDVar4 = zero;
              }
            }
            else {
              if (info->findShortestPath != 0) {
                info->findShortestPath = 0;
              }
LAB_007e3566:
              pDVar4 = BuildSubsetBdd(dd,pathTable,pDVar15,info,subsetNodeTable);
            }
          }
        }
        if (pDVar4 == (DdNode *)0x0) {
          if (pDVar12 != (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar12);
          }
          if (pDVar14 == (DdNode *)0x0) {
            return (DdNode *)0x0;
          }
          Cudd_RecursiveDeref(dd,pDVar14);
          return (DdNode *)0x0;
        }
        piVar16 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar16 = *piVar16 + 1;
        if (pDVar15 == pDVar8) {
          pDVar12 = pDVar4;
          pDVar4 = pDVar14;
        }
        pDVar14 = pDVar4;
        iVar9 = iVar9 + 1;
      } while( true );
    }
    iVar9 = st__lookup(pathTable,(char *)key,(char **)&local_40);
    if (iVar9 != 0) {
      uVar7 = 0xffffffff;
      uVar6 = 0xffffffff;
      if ((*local_40 != -1) && (uVar6 = *local_40 + local_40[2], local_40[2] == -1)) {
        uVar6 = 0xffffffff;
      }
      if ((local_40[1] != -1) && (uVar7 = local_40[1] + local_40[3], local_40[3] == -1)) {
        uVar7 = 0xffffffff;
      }
      uVar5 = uVar7;
      if (uVar6 < uVar7) {
        uVar5 = uVar6;
      }
      uVar6 = local_40[(ulong)(uVar7 < uVar6) + 2];
      pDVar14 = (DdNode *)0x0;
      iVar9 = iVar1;
      goto LAB_007e33ac;
    }
  }
  else {
    iVar1 = st__lookup(pathTable,(char *)piVar17,(char **)&local_38);
    if (iVar1 != 0) {
      uVar5 = 0xffffffff;
      uVar3 = 0xffffffff;
      if ((*local_38 != -1) && (uVar3 = *local_38 + local_38[2], local_38[2] == -1)) {
        uVar3 = 0xffffffff;
      }
      if ((local_38[1] != -1) && (uVar5 = local_38[1] + local_38[3], local_38[3] == -1)) {
        uVar5 = 0xffffffff;
      }
      local_a4 = uVar5;
      if (uVar3 < uVar5) {
        local_a4 = uVar3;
      }
      uVar3 = local_38[(ulong)(uVar5 < uVar3) + 2];
      pDVar12 = (DdNode *)0x0;
      iVar1 = 0;
      goto LAB_007e32c4;
    }
  }
  __s = (FILE *)dd->err;
  __ptr = "Something wrong, node must be in table\n";
  __size = 0x27;
LAB_007e319a:
  fwrite(__ptr,__size,1,__s);
  dd->errorCode = CUDD_INTERNAL_ERROR;
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
BuildSubsetBdd(
  DdManager * dd /* DD manager */,
  DdNode * node /* current node */,
  int * size /* current size of the subset */,
  st__table * visitedTable /* visited table storing all node data */,
  int  threshold,
  st__table * storeTable,
  st__table * approxTable)
{

    DdNode *Nv, *Nnv, *N, *topv, *neW;
    double minNv, minNnv;
    NodeData_t *currNodeQual;
    NodeData_t *currNodeQualT;
    NodeData_t *currNodeQualE;
    DdNode *ThenBranch, *ElseBranch;
    unsigned int topid;
    char *dummy;

#ifdef DEBUG
    num_calls++;
#endif
    /*If the size of the subset is below the threshold, dont do
      anything. */
    if ((*size) <= threshold) {
      /* store nodes below this, so we can recombine if possible */
      StoreNodes(storeTable, dd, node);
      return(node);
    }

    if (Cudd_IsConstant(node))
        return(node);

    /* Look up minterm count for this node. */
    if (! st__lookup(visitedTable, (const char *)node, (char **)&currNodeQual)) {
        fprintf(dd->err,
                "Something is wrong, ought to be in node quality table\n");
    }

    /* Get children. */
    N = Cudd_Regular(node);
    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    /* complement if necessary */
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    if (!Cudd_IsConstant(Nv)) {
        /* find out minterms and nodes contributed by then child */
        if (! st__lookup(visitedTable, (const char *)Nv, (char **)&currNodeQualT)) {
                fprintf(dd->out,"Something wrong, couldnt find nodes in node quality table\n");
                dd->errorCode = CUDD_INTERNAL_ERROR;
                return(NULL);
            }
        else {
            minNv = *(((NodeData_t *)currNodeQualT)->mintermPointer);
        }
    } else {
        if (Nv == zero) {
            minNv = 0;
        } else  {
            minNv = max;
        }
    }
    if (!Cudd_IsConstant(Nnv)) {
        /* find out minterms and nodes contributed by else child */
        if (! st__lookup(visitedTable, (const char *)Nnv, (char **)&currNodeQualE)) {
            fprintf(dd->out,"Something wrong, couldnt find nodes in node quality table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        } else {
            minNnv = *(((NodeData_t *)currNodeQualE)->mintermPointer);
        }
    } else {
        if (Nnv == zero) {
            minNnv = 0;
        } else {
            minNnv = max;
        }
    }

    /* keep track of size of subset by subtracting the number of
     * differential nodes contributed by lighter child
     */
    *size = (*(size)) - (int)*(currNodeQual->lightChildNodesPointer);
    if (minNv >= minNnv) { /*SubsetCountNodesAux procedure takes
                             the Then branch in case of a tie */

        /* recur with the Then branch */
        ThenBranch = (DdNode *)BuildSubsetBdd(dd, Nv, size,
              visitedTable, threshold, storeTable, approxTable);
        if (ThenBranch == NULL) {
            return(NULL);
        }
        cuddRef(ThenBranch);
        /* The Else branch is either a node that already exists in the
         * subset, or one whose approximation has been computed, or
         * Zero.
         */
        if ( st__lookup(storeTable, (char *)Cudd_Regular(Nnv), &dummy)) {
          ElseBranch = Nnv;
          cuddRef(ElseBranch);
        } else {
          if ( st__lookup(approxTable, (char *)Nnv, &dummy)) {
            ElseBranch = (DdNode *)dummy;
            cuddRef(ElseBranch);
          } else {
            ElseBranch = zero;
            cuddRef(ElseBranch);
          }
        }

    }
    else {
        /* recur with the Else branch */
        ElseBranch = (DdNode *)BuildSubsetBdd(dd, Nnv, size,
                      visitedTable, threshold, storeTable, approxTable);
        if (ElseBranch == NULL) {
            return(NULL);
        }
        cuddRef(ElseBranch);
        /* The Then branch is either a node that already exists in the
         * subset, or one whose approximation has been computed, or
         * Zero.
         */
        if ( st__lookup(storeTable, (char *)Cudd_Regular(Nv), &dummy)) {
          ThenBranch = Nv;
          cuddRef(ThenBranch);
        } else {
          if ( st__lookup(approxTable, (char *)Nv, &dummy)) {
            ThenBranch = (DdNode *)dummy;
            cuddRef(ThenBranch);
          } else {
            ThenBranch = zero;
            cuddRef(ThenBranch);
          }
        }
    }

    /* construct the Bdd with the top variable and the two children */
    topid = Cudd_NodeReadIndex(N);
    topv = Cudd_ReadVars(dd, topid);
    cuddRef(topv);
    neW =  cuddBddIteRecur(dd, topv, ThenBranch, ElseBranch);
    if (neW != NULL) {
      cuddRef(neW);
    }
    Cudd_RecursiveDeref(dd, topv);
    Cudd_RecursiveDeref(dd, ThenBranch);
    Cudd_RecursiveDeref(dd, ElseBranch);


    if (neW == NULL)
        return(NULL);
    else {
        /* store this node in the store table */
        if (! st__lookup(storeTable, (char *)Cudd_Regular(neW), &dummy)) {
          cuddRef(neW);
          if (! st__insert(storeTable, (char *)Cudd_Regular(neW), NIL(char)))
              return (NULL);
        }
        /* store the approximation for this node */
        if (N !=  Cudd_Regular(neW)) {
            if ( st__lookup(approxTable, (char *)node, &dummy)) {
                fprintf(dd->err, "This node should not be in the approximated table\n");
            } else {
                cuddRef(neW);
                if (! st__insert(approxTable, (char *)node, (char *)neW))
                    return(NULL);
            }
        }
        cuddDeref(neW);
        return(neW);
    }
}